

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_node.cpp
# Opt level: O2

void duckdb::Node4::ShrinkNode16(ART *art,Node *node4,Node *node16)

{
  uint8_t i;
  BaseNode<(unsigned_char)__x04_,_(duckdb::NType)3> *pBVar1;
  Node16 *pNVar2;
  ulong uVar3;
  byte bVar4;
  
  pBVar1 = BaseNode<(unsigned_char)'\x04',_(duckdb::NType)3>::New(art,node4);
  pNVar2 = Node::Ref<duckdb::Node16>(art,(Node)(node16->super_IndexPointer).data,NODE_16);
  Node::SetGateStatus(node4,(GateStatus)((node16->super_IndexPointer).data >> 0x3f));
  bVar4 = (pNVar2->super_BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4>).count;
  pBVar1->count = bVar4;
  for (uVar3 = 0; uVar3 < bVar4; uVar3 = uVar3 + 1) {
    pBVar1->key[uVar3] =
         (pNVar2->super_BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4>).key[uVar3];
    pBVar1->children[uVar3].super_IndexPointer.data =
         (pNVar2->super_BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4>).children[uVar3].
         super_IndexPointer.data;
    bVar4 = (pNVar2->super_BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4>).count;
  }
  (pNVar2->super_BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4>).count = '\0';
  Node::Free(art,node16);
  return;
}

Assistant:

void Node4::ShrinkNode16(ART &art, Node &node4, Node &node16) {
	auto &n4 = New(art, node4);
	auto &n16 = Node::Ref<Node16>(art, node16, NType::NODE_16);
	node4.SetGateStatus(node16.GetGateStatus());

	n4.count = n16.count;
	for (uint8_t i = 0; i < n16.count; i++) {
		n4.key[i] = n16.key[i];
		n4.children[i] = n16.children[i];
	}

	n16.count = 0;
	Node::Free(art, node16);
}